

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

ArrayPtr<const_char> * __thiscall
kj::Vector<kj::ArrayPtr<char_const>>::add<kj::ArrayPtr<char_const>>
          (Vector<kj::ArrayPtr<char_const>> *this,ArrayPtr<const_char> *params)

{
  bool bVar1;
  ArrayPtr<const_char> *pAVar2;
  ArrayPtr<const_char> *params_local;
  Vector<kj::ArrayPtr<const_char>_> *this_local;
  
  bVar1 = ArrayBuilder<kj::ArrayPtr<const_char>_>::isFull
                    ((ArrayBuilder<kj::ArrayPtr<const_char>_> *)this);
  if (bVar1) {
    Vector<kj::ArrayPtr<const_char>_>::grow((Vector<kj::ArrayPtr<const_char>_> *)this,0);
  }
  pAVar2 = fwd<kj::ArrayPtr<char_const>>(params);
  pAVar2 = ArrayBuilder<kj::ArrayPtr<char_const>>::add<kj::ArrayPtr<char_const>>
                     ((ArrayBuilder<kj::ArrayPtr<char_const>> *)this,pAVar2);
  return pAVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }